

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

void configureParametricProgram(void)

{
  vec3 vVar1;
  GLfloat local_20;
  GLfloat GStack_10;
  vec3 wi;
  
  vVar1 = s2_to_r3(g_sphere.brdf.thetaI,g_sphere.brdf.phiI);
  local_20 = vVar1.z;
  GStack_10 = vVar1.y;
  (*glad_glProgramUniform3f)(g_gl.programs[7],g_gl.uniforms[0x12],vVar1.x,GStack_10,local_20);
  (*glad_glProgramUniform1i)(g_gl.programs[7],g_gl.uniforms[0x16],3);
  (*glad_glProgramUniform1i)(g_gl.programs[7],g_gl.uniforms[0x17],4);
  (*glad_glProgramUniform1f)(g_gl.programs[7],g_gl.uniforms[0x13],g_sphere.brdf.ggxAlpha);
  (*glad_glProgramUniform1f)(g_gl.programs[7],g_gl.uniforms[0x14],g_app.viewer.exposure);
  (*glad_glProgramUniform4f)
            (g_gl.programs[7],g_gl.uniforms[0x15],g_sphere.sphere.color.r,g_sphere.sphere.color.g,
             g_sphere.sphere.color.b,g_sphere.sphere.color.a);
  return;
}

Assistant:

void configureParametricProgram()
{
    dja::vec3 wi = s2_to_r3(g_sphere.brdf.thetaI, g_sphere.brdf.phiI);

    glProgramUniform3f(g_gl.programs[PROGRAM_PARAMETRIC],
                       g_gl.uniforms[UNIFORM_PARAMETRIC_DIR],
                       wi.x, wi.y, wi.z);
    glProgramUniform1i(g_gl.programs[PROGRAM_PARAMETRIC],
                       g_gl.uniforms[UNIFORM_PARAMETRIC_MERL_SAMPLER],
                       TEXTURE_MERL);
    glProgramUniform1i(g_gl.programs[PROGRAM_PARAMETRIC],
                       g_gl.uniforms[UNIFORM_PARAMETRIC_CMAP_SAMPLER],
                       TEXTURE_CMAP);
    glProgramUniform1f(g_gl.programs[PROGRAM_PARAMETRIC],
                       g_gl.uniforms[UNIFORM_PARAMETRIC_ALPHA],
                       g_sphere.brdf.ggxAlpha);
    glProgramUniform1f(g_gl.programs[PROGRAM_PARAMETRIC],
                       g_gl.uniforms[UNIFORM_PARAMETRIC_EXPOSURE],
                       g_app.viewer.exposure);
    glProgramUniform4f(g_gl.programs[PROGRAM_PARAMETRIC],
                       g_gl.uniforms[UNIFORM_PARAMETRIC_COLOR],
                       g_sphere.sphere.color.r,
                       g_sphere.sphere.color.g,
                       g_sphere.sphere.color.b,
                       g_sphere.sphere.color.a);
}